

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

Expression *
slang::ast::Expression::tryBindInterfaceRef
          (ASTContext *context,ExpressionSyntax *syntax,bool isInterfacePort)

{
  SyntaxKind kind;
  Compilation *compilation;
  InstanceBodySymbol *pIVar1;
  ResolvedConfig *pRVar2;
  ConfigRule *pCVar3;
  DeferredSourceRange sourceRange_00;
  __extent_storage<18446744073709551615UL> _Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 this;
  bool bVar9;
  SymbolKind SVar10;
  variant_alternative_t<0UL,_variant<const_ElementSelectSyntax_*,_MemberSelector>_> *args;
  Symbol *pSVar11;
  ArbitrarySymbolExpression *pAVar12;
  Diagnostic *pDVar13;
  Type *this_00;
  Type *pTVar14;
  InstanceSymbol *pIVar15;
  VirtualInterfaceType *elementType;
  SyntaxNode *pSVar16;
  char *pcVar17;
  long lVar18;
  LookupResult *args_00;
  LookupResult *in_R9;
  SourceLocation SVar19;
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector> *sel
  ;
  SyntaxNode *pSVar20;
  InstanceBodySymbol **ppIVar21;
  IfaceConn IVar22;
  string_view sVar23;
  SourceRange SVar24;
  SourceRange SVar25;
  string_view arg;
  string_view arg_00;
  span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> selectors;
  span<const_slang::ConstantRange,_18446744073709551615UL> dimensions;
  ModportSymbol *modport;
  SourceRange sourceRange;
  HierarchicalReference hierRef;
  SmallVector<slang::ConstantRange,_4UL> dims;
  LookupResult result;
  size_t local_530;
  InstanceSymbol *local_528;
  char *local_520;
  SourceRange local_518;
  SyntaxNode *local_508;
  HierarchicalReference *local_500;
  SourceLocation local_4f8;
  SourceLocation SStack_4f0;
  undefined8 local_4e8;
  undefined1 local_4e0 [40];
  undefined1 local_4b8 [32];
  size_type local_498;
  size_type local_490;
  undefined1 local_488 [192];
  Element *local_3c8;
  size_type local_3c0;
  size_type local_3b8;
  Element local_3b0 [2];
  SmallVectorBase<slang::Diagnostic> local_370;
  undefined1 local_278 [240];
  SmallVectorBase<slang::ast::HierarchicalReference::Element> local_188;
  SmallVectorBase<slang::Diagnostic> local_130;
  
  kind = (syntax->super_SyntaxNode).kind;
  pSVar16 = &syntax->super_SyntaxNode;
  while (kind == ParenthesizedExpression) {
    pSVar16 = pSVar16[1].previewNode;
    kind = pSVar16->kind;
  }
  bVar9 = slang::syntax::NameSyntax::isKind(kind);
  if (!bVar9) {
    if (isInterfacePort) {
      SVar24 = slang::syntax::SyntaxNode::sourceRange(pSVar16);
      ASTContext::addDiag(context,(DiagCode)0x5f0007,SVar24);
    }
    return (Expression *)0x0;
  }
  local_278._24_8_ = local_278 + 0x30;
  local_278._0_8_ = (LookupResult *)0x0;
  local_278._8_5_ = 0;
  local_278._13_3_ = 0;
  local_278._16_4_ = 0;
  local_278[0x14] = 0;
  local_278._32_8_ = (TempVarSymbol *)0x0;
  local_278._40_8_ = (RandomizeDetails *)0x4;
  local_188.data_ = (pointer)local_188.firstElement;
  local_188.len = 0;
  local_188.cap = 2;
  local_130.data_ = (pointer)local_130.firstElement;
  local_130.len = 0;
  local_130.cap = 2;
  args_00 = (LookupResult *)context;
  Lookup::name((NameSyntax *)pSVar16,context,
               (bitmask<slang::ast::LookupFlags>)((uint)isInterfacePort << 10),
               (LookupResult *)local_278);
  local_530 = 0;
  pSVar20 = (SyntaxNode *)0x0;
  pcVar17 = (char *)0x0;
  if ((LookupResult *)local_278._0_8_ == (LookupResult *)0x0) {
    if (((pSVar16->kind == ScopedName) && (*(short *)&pSVar16[1].parent == 0x19)) &&
       (**(int **)(pSVar16 + 2) == 0xe5)) {
      local_4b8._0_8_ = (LookupResult *)0x0;
      local_4b8[8] = '\0';
      local_4b8[9] = '\0';
      local_4b8[10] = '\0';
      local_4b8[0xb] = '\0';
      local_4b8[0xc] = '\0';
      local_4b8[0xd] = '\0';
      local_4b8[0xe] = '\0';
      local_4b8[0xf] = '\0';
      local_4b8[0x10] = '\0';
      local_4b8[0x11] = '\0';
      local_4b8[0x12] = '\0';
      local_4b8[0x13] = '\0';
      local_4b8[0x14] = '\0';
      local_498 = 0;
      local_490 = 4;
      local_3c0 = 0;
      local_3b8 = 2;
      local_370.data_ = (pointer)local_370.firstElement;
      local_370.len = 0;
      local_370.cap = 2;
      args_00 = (LookupResult *)context;
      local_4b8._24_8_ = local_488;
      local_3c8 = local_3b0;
      Lookup::name(*(NameSyntax **)(pSVar16 + 1),context,(bitmask<slang::ast::LookupFlags>)0x0,
                   (LookupResult *)local_4b8);
      sVar23 = parsing::Token::valueText((Token *)(*(long *)(pSVar16 + 2) + 0x18));
      local_520 = sVar23._M_str;
      local_530 = sVar23._M_len;
      pSVar20 = (SyntaxNode *)0x0;
      if (((LookupResult *)local_4b8._0_8_ != (LookupResult *)0x0) && (local_530 != 0)) {
        if ((*(int *)(Symbol **)local_4b8._0_8_ == 0x31) ||
           (*(int *)(Symbol **)local_4b8._0_8_ == 0x2b)) {
          args_00 = (LookupResult *)local_4b8;
          LookupResult::operator=((LookupResult *)local_278,args_00);
          pSVar20 = *(SyntaxNode **)(pSVar16 + 2);
        }
        else {
          pSVar20 = (SyntaxNode *)0x0;
        }
      }
      SmallVectorBase<slang::Diagnostic>::cleanup(&local_370,(EVP_PKEY_CTX *)args_00);
      if (local_3c8 != local_3b0) {
        operator_delete(local_3c8);
      }
      if ((undefined1 *)local_4b8._24_8_ != local_488) {
        operator_delete((void *)local_4b8._24_8_);
      }
      pcVar17 = local_520;
      if ((LookupResult *)local_278._0_8_ != (LookupResult *)0x0) goto LAB_00224da3;
    }
    if (isInterfacePort) {
      LookupResult::reportDiags((LookupResult *)local_278,context);
      args_00 = (LookupResult *)context;
    }
    pAVar12 = (ArbitrarySymbolExpression *)0x0;
    goto LAB_0022551a;
  }
LAB_00224da3:
  this = local_278._0_8_;
  compilation = ((context->scope).ptr)->compilation;
  local_528 = (InstanceSymbol *)0x0;
  IVar22.second = (ModportSymbol *)0x0;
  IVar22.first = (Symbol *)local_278._0_8_;
  local_520 = pcVar17;
  local_508 = pSVar20;
  if (*(int *)(Compilation **)local_278._0_8_ == 0x2b) {
    local_278[0x14] = local_278[0x14] | 0x20;
    args_00 = (LookupResult *)local_278._0_8_;
    SmallVectorBase<slang::ast::HierarchicalReference::Element>::
    emplace_back<slang::ast::Symbol_const&>(&local_188,(Symbol *)local_278._0_8_);
    IVar22 = InterfacePortSymbol::getConnection((InterfacePortSymbol *)this);
    local_528 = (InstanceSymbol *)IVar22.second;
    if (IVar22.first == (Symbol *)0x0) {
LAB_002250a1:
      LookupResult::reportDiags((LookupResult *)local_278,context);
      args_00 = (LookupResult *)local_4b8;
      local_4b8._0_8_ = (LookupResult *)0x0;
      pAVar12 = (ArbitrarySymbolExpression *)
                BumpAllocator::
                emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                          (&compilation->super_BumpAllocator,(Expression **)args_00,
                           compilation->errorType);
      goto LAB_0022551a;
    }
    if ((TempVarSymbol *)local_278._32_8_ != (TempVarSymbol *)0x0) {
      local_4b8._0_8_ = local_4b8 + 0x18;
      local_4b8[8] = '\0';
      local_4b8[9] = '\0';
      local_4b8[10] = '\0';
      local_4b8[0xb] = '\0';
      local_4b8[0xc] = '\0';
      local_4b8[0xd] = '\0';
      local_4b8[0xe] = '\0';
      local_4b8[0xf] = '\0';
      local_4b8[0x10] = '\x05';
      local_4b8[0x11] = '\0';
      local_4b8[0x12] = '\0';
      local_4b8[0x13] = '\0';
      local_4b8[0x14] = '\0';
      local_4b8[0x15] = '\0';
      local_4b8[0x16] = '\0';
      local_4b8[0x17] = '\0';
      lVar18 = local_278._32_8_ * 0x30;
      pSVar11 = (Symbol *)local_278._24_8_;
      do {
        args = std::
               get<0ul,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                         ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                           *)pSVar11);
        SmallVectorBase<slang::syntax::ElementSelectSyntax_const*>::
        emplace_back<slang::syntax::ElementSelectSyntax_const*const&>
                  ((SmallVectorBase<slang::syntax::ElementSelectSyntax_const*> *)local_4b8,args);
        pSVar11 = (Symbol *)&pSVar11->indexInScope;
        lVar18 = lVar18 + -0x30;
      } while (lVar18 != 0);
      selectors._M_ptr._5_3_ = local_4b8._13_3_;
      selectors._M_ptr._0_5_ = local_4b8._8_5_;
      selectors._M_extent._M_extent_value = (size_t)context;
      args_00 = (LookupResult *)local_4b8._0_8_;
      pSVar11 = Lookup::selectChild((Lookup *)IVar22.first,(Symbol *)local_4b8._0_8_,selectors,
                                    (ASTContext *)local_278,in_R9);
      local_278._32_8_ = (TempVarSymbol *)0x0;
      if ((LookupResult *)local_4b8._0_8_ != (LookupResult *)(local_4b8 + 0x18)) {
        operator_delete((void *)local_4b8._0_8_);
      }
      IVar22.second = (ModportSymbol *)local_528;
      IVar22.first = pSVar11;
      if (pSVar11 == (Symbol *)0x0) goto LAB_002250a1;
    }
  }
  pSVar11 = IVar22.first;
  local_4b8._0_8_ = local_4b8 + 0x18;
  local_4b8[8] = '\0';
  local_4b8[9] = '\0';
  local_4b8[10] = '\0';
  local_4b8[0xb] = '\0';
  local_4b8[0xc] = '\0';
  local_4b8[0xd] = '\0';
  local_4b8[0xe] = '\0';
  local_4b8[0xf] = '\0';
  local_4b8[0x10] = '\x04';
  local_4b8[0x11] = '\0';
  local_4b8[0x12] = '\0';
  local_4b8[0x13] = '\0';
  local_4b8[0x14] = '\0';
  local_4b8[0x15] = '\0';
  local_4b8[0x16] = '\0';
  local_4b8[0x17] = '\0';
  while( true ) {
    local_528 = (InstanceSymbol *)IVar22.second;
    pIVar15 = (InstanceSymbol *)IVar22.first;
    SVar10 = (pIVar15->super_InstanceSymbolBase).super_Symbol.kind;
    if (SVar10 != InstanceArray) break;
    if (*(long *)&pIVar15[1].super_InstanceSymbolBase.super_Symbol == 0) {
      args_00 = (LookupResult *)local_4e0;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_4e0._8_8_;
      local_4e0._0_16_ = auVar5 << 0x40;
      pAVar12 = (ArbitrarySymbolExpression *)
                BumpAllocator::
                emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                          (&compilation->super_BumpAllocator,(Expression **)args_00,
                           compilation->errorType);
      goto LAB_0022549c;
    }
    args_00 = (LookupResult *)&pIVar15[1].super_InstanceSymbolBase.super_Symbol.name;
    SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange_const&>
              ((SmallVectorBase<slang::ConstantRange> *)local_4b8,(ConstantRange *)args_00);
    IVar22.second = (ModportSymbol *)local_528;
    IVar22.first = *(Symbol **)&pIVar15->canonicalBody->super_Symbol;
  }
  if (SVar10 == Modport) {
LAB_00225050:
    LookupResult::reportDiags((LookupResult *)local_278,context);
    LookupResult::errorIfSelectors((LookupResult *)local_278,context);
    SVar24 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    if ((pIVar15->super_InstanceSymbolBase).super_Symbol.kind == Modport) {
      ppIVar21 = (InstanceBodySymbol **)
                 &((pIVar15->super_InstanceSymbolBase).super_Symbol.parentScope)->thisSym;
      local_528 = pIVar15;
    }
    else {
      ppIVar21 = &pIVar15->body;
    }
    pIVar1 = *ppIVar21;
    local_518 = SVar24;
    if (!isInterfacePort) {
      if (pIVar1->hierarchyOverrideNode != (HierarchyOverrideNode *)0x0) {
        pDVar13 = ASTContext::addDiag(context,(DiagCode)0xab0007,SVar24);
        pSVar16 = findOverrideNodeSource(pIVar1->hierarchyOverrideNode);
        if (pSVar16 != (SyntaxNode *)0x0) {
          SVar25 = slang::syntax::SyntaxNode::sourceRange(pSVar16);
          Diagnostic::addNote(pDVar13,(DiagCode)0x50001,SVar25);
        }
      }
      if ((pIVar1->parentInstance != (InstanceSymbol *)0x0) &&
         (pIVar1->parentInstance->resolvedConfig != (ResolvedConfig *)0x0)) {
        pDVar13 = ASTContext::addDiag(context,(DiagCode)0xaa0007,SVar24);
        pRVar2 = pIVar1->parentInstance->resolvedConfig;
        pCVar3 = pRVar2->configRule;
        if (pCVar3 == (ConfigRule *)0x0) {
          Diagnostic::addNote(pDVar13,(DiagCode)0x40001,(pRVar2->useConfig->super_Symbol).location);
        }
        else {
          SVar25 = slang::syntax::SyntaxNode::sourceRange((pCVar3->syntax).ptr);
          Diagnostic::addNote(pDVar13,(DiagCode)0x40001,SVar25);
        }
      }
    }
    SVar19 = SVar24.startLoc;
    if (local_530 == 0) {
LAB_002252cb:
      local_500 = (HierarchicalReference *)CONCAT71(local_500._1_7_,1);
      local_4e0._0_8_ = SVar19;
      elementType = BumpAllocator::
                    emplace<slang::ast::VirtualInterfaceType,slang::ast::InstanceSymbol_const&,slang::ast::ModportSymbol_const*&,bool,slang::SourceLocation>
                              (&compilation->super_BumpAllocator,pIVar1->parentInstance,
                               (ModportSymbol **)&local_528,(bool *)&local_500,
                               (SourceLocation *)local_4e0);
      _Var4._M_extent_value._5_3_ = local_4b8._13_3_;
      _Var4._M_extent_value._0_5_ = local_4b8._8_5_;
      if (_Var4._M_extent_value != 0) {
        SStack_4f0 = local_518.endLoc;
        local_4e8 = 1;
        sourceRange_00.range.endLoc = local_518.endLoc;
        sourceRange_00.range.startLoc = SVar19;
        sourceRange_00.node.value = 1;
        dimensions._M_extent._M_extent_value = _Var4._M_extent_value;
        dimensions._M_ptr = (pointer)local_4b8._0_8_;
        local_4f8 = SVar19;
        elementType = (VirtualInterfaceType *)
                      FixedSizeUnpackedArrayType::fromDims
                                ((context->scope).ptr,&elementType->super_Type,dimensions,
                                 sourceRange_00);
      }
      if (pSVar11->kind == Modport) {
        pSVar11 = (Symbol *)pSVar11->parentScope->thisSym[1].originatingSyntax;
      }
      HierarchicalReference::fromLookup
                ((HierarchicalReference *)local_4e0,compilation,(LookupResult *)local_278);
      args_00 = (LookupResult *)(context->scope).ptr;
      local_500 = (HierarchicalReference *)local_4e0;
      pAVar12 = BumpAllocator::
                emplace<slang::ast::ArbitrarySymbolExpression,slang::ast::Scope_const&,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::ast::HierarchicalReference*,slang::SourceRange&>
                          (&compilation->super_BumpAllocator,(Scope *)args_00,pSVar11,
                           &elementType->super_Type,&local_500,&local_518);
    }
    else if (local_528 == (InstanceSymbol *)0x0) {
      sVar23._M_str = local_520;
      sVar23._M_len = local_530;
      pIVar15 = (InstanceSymbol *)Scope::find(&pIVar1->super_Scope,sVar23);
      if ((pIVar15 != (InstanceSymbol *)0x0) &&
         ((pIVar15->super_InstanceSymbolBase).super_Symbol.kind == Modport)) {
        SVar19 = local_518.startLoc;
        local_528 = pIVar15;
        goto LAB_002252cb;
      }
      if (local_508 == (SyntaxNode *)0x0 || ((ulong)local_508 & 1) != 0) {
        SVar24 = (SourceRange)ZEXT816(0);
      }
      else {
        SVar24 = slang::syntax::SyntaxNode::sourceRange(local_508);
      }
      pDVar13 = ASTContext::addDiag(context,(DiagCode)0x22000a,SVar24);
      arg_00._M_str = local_520;
      arg_00._M_len = local_530;
      Diagnostic::operator<<(pDVar13,arg_00);
      Diagnostic::operator<<(pDVar13,(pIVar1->definition->super_Symbol).name);
      args_00 = (LookupResult *)local_4e0;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_4e0._8_8_;
      local_4e0._0_16_ = auVar8 << 0x40;
      pAVar12 = (ArbitrarySymbolExpression *)
                BumpAllocator::
                emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                          (&compilation->super_BumpAllocator,(Expression **)args_00,
                           compilation->errorType);
    }
    else {
      if (local_508 == (SyntaxNode *)0x0 || ((ulong)local_508 & 1) != 0) {
        SVar24 = (SourceRange)ZEXT816(0);
      }
      else {
        SVar24 = slang::syntax::SyntaxNode::sourceRange(local_508);
      }
      pDVar13 = ASTContext::addDiag(context,(DiagCode)0x14000a,SVar24);
      arg._M_str = local_520;
      arg._M_len = local_530;
      Diagnostic::operator<<(pDVar13,arg);
      Diagnostic::operator<<(pDVar13,(pIVar1->definition->super_Symbol).name);
      Diagnostic::operator<<(pDVar13,(local_528->super_InstanceSymbolBase).super_Symbol.name);
      args_00 = (LookupResult *)local_4e0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_4e0._8_8_;
      local_4e0._0_16_ = auVar7 << 0x40;
      pAVar12 = (ArbitrarySymbolExpression *)
                BumpAllocator::
                emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                          (&compilation->super_BumpAllocator,(Expression **)args_00,
                           compilation->errorType);
    }
  }
  else {
    if (SVar10 == Instance) {
      bVar9 = InstanceSymbol::isInterface(pIVar15);
      if (bVar9) goto LAB_00225050;
      SVar10 = (pIVar15->super_InstanceSymbolBase).super_Symbol.kind;
    }
    if (SVar10 == UninstantiatedDef) {
LAB_002251b7:
      args_00 = (LookupResult *)(context->scope).ptr;
      pTVar14 = compilation->errorType;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_518.endLoc;
      local_518 = (SourceRange)(auVar6 << 0x40);
      local_4e0._0_16_ =
           (undefined1  [16])slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
      pAVar12 = BumpAllocator::
                emplace<slang::ast::ArbitrarySymbolExpression,slang::ast::Scope_const&,slang::ast::Symbol_const&,slang::ast::Type_const&,decltype(nullptr),slang::SourceRange>
                          (&compilation->super_BumpAllocator,(Scope *)args_00,pSVar11,pTVar14,
                           (void **)&local_518,(SourceRange *)local_4e0);
    }
    else {
      if (SVar10 == Variable) {
        this_00 = DeclaredType::getType
                            ((DeclaredType *)&(pIVar15->super_InstanceSymbolBase).arrayPath);
        pTVar14 = this_00->canonical;
        if (pTVar14 == (Type *)0x0) {
          Type::resolveCanonical(this_00);
          pTVar14 = this_00->canonical;
        }
        if ((pTVar14->super_Symbol).kind == ErrorType) goto LAB_002251b7;
      }
      if ((isInterfacePort) && ((pSVar11->name)._M_len != 0)) {
        SVar24 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
        pDVar13 = ASTContext::addDiag(context,(DiagCode)0x26000a,SVar24);
        pDVar13 = Diagnostic::operator<<(pDVar13,pSVar11->name);
        args_00 = (LookupResult *)0x50001;
        Diagnostic::addNote(pDVar13,(DiagCode)0x50001,pSVar11->location);
      }
      pAVar12 = (ArbitrarySymbolExpression *)0x0;
    }
  }
LAB_0022549c:
  if ((LookupResult *)local_4b8._0_8_ != (LookupResult *)(local_4b8 + 0x18)) {
    operator_delete((void *)local_4b8._0_8_);
  }
LAB_0022551a:
  SmallVectorBase<slang::Diagnostic>::cleanup(&local_130,(EVP_PKEY_CTX *)args_00);
  if (local_188.data_ != (pointer)local_188.firstElement) {
    operator_delete(local_188.data_);
  }
  if ((Symbol *)local_278._24_8_ != (Symbol *)(local_278 + 0x30)) {
    operator_delete((void *)local_278._24_8_);
  }
  return &pAVar12->super_Expression;
}

Assistant:

Expression* Expression::tryBindInterfaceRef(const ASTContext& context,
                                            const ExpressionSyntax& syntax, bool isInterfacePort) {
    // Unwrap the expression; parentheses are superfluous.
    const ExpressionSyntax* expr = &syntax;
    while (expr->kind == SyntaxKind::ParenthesizedExpression)
        expr = expr->as<ParenthesizedExpressionSyntax>().expression;

    // Connection must be a name (not some arbitrary expression).
    if (!NameSyntax::isKind(expr->kind)) {
        if (isInterfacePort)
            context.addDiag(diag::InterfacePortInvalidExpression, expr->sourceRange());
        return nullptr;
    }

    // Try to look up that name.
    LookupResult result;
    auto flags = isInterfacePort ? LookupFlags::IfacePortConn : LookupFlags::None;
    Lookup::name(expr->as<NameSyntax>(), context, flags, result);

    DeferredSourceRange modportRange;
    std::string_view arrayModportName;
    if (!result.found) {
        // We didn't find the name as-is. This might be a case where the user has
        // provided an explicit modport name on top of an array of interfaces,
        // which we should support by looking up the name again without the trailing
        // name component and taking the result if it's an iface array.
        if (expr->kind == SyntaxKind::ScopedName) {
            auto& scoped = expr->as<ScopedNameSyntax>();
            if (scoped.separator.kind == TokenKind::Dot &&
                scoped.right->kind == SyntaxKind::IdentifierName) {
                LookupResult result2;
                Lookup::name(*scoped.left, context, LookupFlags::None, result2);
                arrayModportName = scoped.right->as<IdentifierNameSyntax>().identifier.valueText();

                auto found = result2.found;
                if (found && !arrayModportName.empty() &&
                    (found->kind == SymbolKind::InterfacePort ||
                     found->kind == SymbolKind::InstanceArray)) {
                    result = result2;
                    modportRange = *scoped.right;
                }
            }
        }

        // If still not found we can't make a connection. Error if this is for a
        // port, and otherwise return null to let the caller try binding as a
        // normal expression.
        if (!result.found) {
            if (isInterfacePort)
                result.reportDiags(context);
            return nullptr;
        }
    }

    auto& comp = context.getCompilation();
    auto symbol = result.found;
    const InterfacePortSymbol* ifacePort = nullptr;
    const ModportSymbol* modport = nullptr;

    // If we found an interface port we should unwrap to what it's connected to.
    if (symbol->kind == SymbolKind::InterfacePort) {
        result.flags |= LookupResultFlags::IfacePort;
        result.path.emplace_back(*symbol);

        ifacePort = &symbol->as<InterfacePortSymbol>();
        std::tie(symbol, modport) = ifacePort->getConnection();

        if (symbol && !result.selectors.empty()) {
            SmallVector<const ElementSelectSyntax*> selectors;
            for (auto& sel : result.selectors)
                selectors.push_back(std::get<0>(sel));

            symbol = Lookup::selectChild(*symbol, selectors, context, result);
            result.selectors.clear();
        }

        if (!symbol) {
            // Returning nullptr from this function means to try doing normal expression
            // creation, but if we hit this case here we found the iface and simply failed
            // to connect it, likely because we're in an uninstantiated context. Return
            // a badExpr here to silence any follow on errors that might otherwise result.
            result.reportDiags(context);
            return &badExpr(comp, nullptr);
        }
    }

    // Unwrap any interface arrays we found, collect the dimensions along the way.
    SmallVector<ConstantRange, 4> dims;
    auto origSymbol = symbol;
    while (symbol->kind == SymbolKind::InstanceArray) {
        auto& array = symbol->as<InstanceArraySymbol>();
        if (array.elements.empty())
            return &badExpr(comp, nullptr);

        dims.push_back(array.range);
        symbol = array.elements[0];
    }

    // If we didn't find a modport or an interface instance then this is not
    // an interface connection.
    if (symbol->kind != SymbolKind::Modport &&
        (symbol->kind != SymbolKind::Instance || !symbol->as<InstanceSymbol>().isInterface())) {
        // If this is a variable with an errored type, an error is already emitted.
        if (symbol->kind == SymbolKind::UninstantiatedDef ||
            (symbol->kind == SymbolKind::Variable &&
             symbol->as<VariableSymbol>().getType().isError())) {
            return comp.emplace<ArbitrarySymbolExpression>(*context.scope, *origSymbol,
                                                           comp.getErrorType(), nullptr,
                                                           syntax.sourceRange());
        }

        if (isInterfacePort && !origSymbol->name.empty()) {
            auto& diag = context.addDiag(diag::NotAnInterface, syntax.sourceRange())
                         << origSymbol->name;
            diag.addNote(diag::NoteDeclarationHere, origSymbol->location);
        }

        // Return nullptr to let the parent try normal expression binding.
        return nullptr;
    }

    // At this point we've found a connection so we're no longer speculatively
    // trying to connect, we're going to connect or issue an error.
    result.reportDiags(context);
    result.errorIfSelectors(context);

    auto sourceRange = syntax.sourceRange();
    const InstanceBodySymbol* iface = nullptr;
    if (symbol->kind == SymbolKind::Modport) {
        modport = &symbol->as<ModportSymbol>();
        iface = &symbol->getParentScope()->asSymbol().as<InstanceBodySymbol>();
    }
    else {
        iface = &symbol->as<InstanceSymbol>().body;
    }

    if (!isInterfacePort) {
        if (iface->hierarchyOverrideNode) {
            auto& diag = context.addDiag(diag::VirtualIfaceDefparam, sourceRange);
            if (auto source = findOverrideNodeSource(*iface->hierarchyOverrideNode))
                diag.addNote(diag::NoteDeclarationHere, source->sourceRange());
        }

        if (iface->parentInstance && iface->parentInstance->resolvedConfig) {
            auto& diag = context.addDiag(diag::VirtualIfaceConfigRule, sourceRange);

            auto rc = iface->parentInstance->resolvedConfig;
            if (rc->configRule)
                diag.addNote(diag::NoteConfigRule, rc->configRule->syntax->sourceRange());
            else
                diag.addNote(diag::NoteConfigRule, rc->useConfig.location);
        }
    }

    if (!arrayModportName.empty()) {
        if (modport) {
            // If we connected via an interface port that itself has a modport restriction,
            // we can't also be restricting via an interface array modport.
            auto& diag = context.addDiag(diag::InvalidModportAccess, *modportRange);
            diag << arrayModportName;
            diag << iface->getDefinition().name;
            diag << modport->name;
            return &badExpr(comp, nullptr);
        }
        else {
            auto sym = iface->find(arrayModportName);
            if (!sym || sym->kind != SymbolKind::Modport) {
                auto& diag = context.addDiag(diag::NotAModport, *modportRange);
                diag << arrayModportName;
                diag << iface->getDefinition().name;
                return &badExpr(comp, nullptr);
            }

            modport = &sym->as<ModportSymbol>();
        }
    }

    // Now make sure the interface or modport we found matches the target type.
    // Fabricate a virtual interface type for the rhs that we can use for matching.
    SLANG_ASSERT(iface->parentInstance);
    const Type* type = comp.emplace<VirtualInterfaceType>(*iface->parentInstance, modport,
                                                          /* isRealIface */ true,
                                                          sourceRange.start());
    if (!dims.empty())
        type = &FixedSizeUnpackedArrayType::fromDims(*context.scope, *type, dims, sourceRange);

    // Don't return a modport as the symbol target, it's expected that it
    // will be pulled from the virtual interface type instead.
    if (origSymbol->kind == SymbolKind::Modport) {
        origSymbol = &origSymbol->getParentScope()->asSymbol();
        origSymbol = origSymbol->as<InstanceBodySymbol>().parentInstance;
    }

    auto hierRef = HierarchicalReference::fromLookup(comp, result);
    return comp.emplace<ArbitrarySymbolExpression>(*context.scope, *origSymbol, *type, &hierRef,
                                                   sourceRange);
}